

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxMemory.h
# Opt level: O1

char * __thiscall
Jinx::StaticArena<8192ul,16ul>::allocate<4ul>(StaticArena<8192ul,16ul> *this,size_t n)

{
  char *r;
  char *pcVar1;
  ulong uVar2;
  StaticArena<8192ul,16ul> *pSVar3;
  
  r = *(char **)(this + 0x2000);
  if (this <= r) {
    pSVar3 = this + 0x2000;
    if (r <= pSVar3) {
      uVar2 = n + 0xf & 0xfffffffffffffff0;
      if ((ulong)((long)pSVar3 - (long)r) < uVar2) {
        pcVar1 = (char *)MemAllocate(n);
        return pcVar1;
      }
      *(StaticArena<8192ul,16ul> **)pSVar3 = (StaticArena<8192ul,16ul> *)r + uVar2;
      return r;
    }
  }
  __assert_fail("pointer_in_buffer(m_ptr) && \"short_alloc has outlived arena\"",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxMemory.h"
                ,0x51,
                "char *Jinx::StaticArena<8192>::allocate(std::size_t) [N = 8192, alignment = 16, ReqAlign = 4UL]"
               );
}

Assistant:

char * StaticArena<N, alignment>::allocate(std::size_t n)
	{
		static_assert(ReqAlign <= alignment, "alignment is too small for this arena");
		assert(pointer_in_buffer(m_ptr) && "short_alloc has outlived arena");
		auto const aligned_n = align_up(n);
		if (static_cast<decltype(aligned_n)>(m_buffer + N - m_ptr) >= aligned_n)
		{
			char * r = m_ptr;
			m_ptr += aligned_n;
			return r;
		}

		static_assert(alignment <= alignof(std::max_align_t), "you've chosen an "
			"alignment that is larger than alignof(std::max_align_t), and "
			"cannot be guaranteed by normal operator new");
		return static_cast<char *>(Jinx::MemAllocate(n));
	}